

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sockets.cpp
# Opt level: O0

ssize_t __thiscall Socket::read(Socket *this,int __fd,void *__buf,size_t __nbytes)

{
  bool bVar1;
  int iVar2;
  unsigned_long *puVar3;
  ssize_t sVar4;
  int *piVar5;
  runtime_error *this_00;
  ostream *poVar6;
  char *pcVar7;
  undefined4 in_register_00000034;
  string local_200 [32];
  stringstream local_1e0 [8];
  stringstream stream;
  ostream local_1d0 [392];
  int local_48;
  int local_44;
  int lastError;
  int bytesRead;
  int local_34;
  size_t sStack_30;
  int msvcMaxBytes;
  timeval *timeout_local;
  size_t maxBytes_local;
  uint8_t *buffer_local;
  Socket *this_local;
  
  maxBytes_local = CONCAT44(in_register_00000034,__fd);
  sStack_30 = __nbytes;
  timeout_local = (timeval *)__buf;
  buffer_local = (uint8_t *)this;
  bVar1 = Select(this,(timeval *)__nbytes);
  if (bVar1) {
    iVar2 = std::numeric_limits<int>::max();
    _lastError = (unsigned_long)iVar2;
    puVar3 = std::min<unsigned_long>((unsigned_long *)&lastError,(unsigned_long *)&timeout_local);
    local_34 = (int)*puVar3;
    sVar4 = recv(this->m_Socket,(void *)maxBytes_local,(long)local_34,0);
    local_44 = (int)sVar4;
    if (local_44 < 1) {
      piVar5 = __errno_location();
      local_48 = *piVar5;
      if (((local_44 == 0) || (local_48 == 0x6b)) || (local_48 == 0x67)) {
        this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(this_00,"connection closed by remote");
        __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      std::__cxx11::stringstream::stringstream(local_1e0);
      poVar6 = std::operator<<(local_1d0,"read frame failed with error: ");
      poVar6 = (ostream *)std::ostream::operator<<(poVar6,std::dec);
      pcVar7 = strerror(local_48);
      std::operator<<(poVar6,pcVar7);
      std::__cxx11::stringstream::str();
      Logger::Log(3,local_200);
      std::__cxx11::string::~string((string *)local_200);
      std::__cxx11::stringstream::~stringstream(local_1e0);
      this_local = (Socket *)0x0;
    }
    else {
      this_local = (Socket *)(long)local_44;
    }
  }
  else {
    this_local = (Socket *)0x0;
  }
  return (ssize_t)this_local;
}

Assistant:

size_t Socket::read(uint8_t* buffer, size_t maxBytes, timeval* timeout) const
{
    if (!Select(timeout)) {
        return 0;
    }

    const auto msvcMaxBytes = static_cast<int>(std::min<size_t>(std::numeric_limits<int>::max(), maxBytes));
    const int bytesRead = recv(m_Socket, reinterpret_cast<char*>(buffer), msvcMaxBytes, 0);
    if (bytesRead > 0) {
        return bytesRead;
    }
    const auto lastError = WSAGetLastError();
    if ((0 == bytesRead) || (lastError == CONNECTION_CLOSED) || (lastError == CONNECTION_ABORTED)) {
        throw std::runtime_error("connection closed by remote");
    } else {
        LOG_ERROR("read frame failed with error: " << std::dec << std::strerror(lastError));
    }
    return 0;
}